

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_00;
  undefined8 *puVar1;
  int iVar2;
  pointer pBVar3;
  int *piVar4;
  void *pvVar5;
  Allocator *pAVar6;
  pointer pMVar7;
  long *plVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Layer *pLVar12;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar13;
  int *piVar14;
  ulong uVar15;
  long lVar16;
  int top_count;
  int bottom_count;
  int typeindex;
  int blob_count;
  int layer_count;
  int magic;
  ParamDict pd;
  int bottom_blob_index;
  int local_120;
  int local_11c;
  Mat local_118;
  Layer *local_d0;
  uint local_c4;
  int local_c0;
  int local_bc;
  vector<int,_std::allocator<int>_> *local_b8;
  int local_ac;
  Net *local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  ParamDict local_98;
  DataReader *local_88;
  ulong local_80;
  Mat local_78;
  
  local_ac = 0;
  iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_ac,4);
  if (CONCAT44(extraout_var,iVar11) == 4) {
    if (local_ac == 0x7685dd) {
      local_bc = 0;
      local_c0 = 0;
      iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_bc,4);
      if (CONCAT44(extraout_var_00,iVar11) == 4) {
        iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_c0,4);
        if (CONCAT44(extraout_var_01,iVar11) == 4) {
          if ((0 < (long)local_bc) && (0 < local_c0)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)local_bc);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)local_c0);
            ParamDict::ParamDict(&local_98);
            if (0 < local_bc) {
              uVar15 = 0;
              local_a8 = this;
              local_88 = dr;
              do {
                iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_c4,4);
                if (CONCAT44(extraout_var_02,iVar11) != 4) {
                  load_param_bin();
LAB_001488f2:
                  iVar11 = -1;
                  goto LAB_001488f7;
                }
                iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_11c,4);
                if (CONCAT44(extraout_var_03,iVar11) != 4) {
                  load_param_bin();
                  goto LAB_001488f2;
                }
                iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_120,4);
                if (CONCAT44(extraout_var_04,iVar11) != 4) {
                  load_param_bin();
                  goto LAB_001488f2;
                }
                pLVar12 = create_layer(local_c4);
                if (pLVar12 == (Layer *)0x0) {
                  iVar11 = (*this->_vptr_Net[4])(this,(ulong)(local_c4 & 0xfffffeff));
                  pLVar12 = (Layer *)CONCAT44(extraout_var_05,iVar11);
                  if (pLVar12 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %d not exists or registered",(ulong)local_c4);
                    fputc(10,_stderr);
                    clear(this);
                    goto LAB_001488f2;
                  }
                }
                local_a0 = &pLVar12->bottoms;
                std::vector<int,_std::allocator<int>_>::resize(local_a0,(long)local_11c);
                local_d0 = pLVar12;
                if (0 < local_11c) {
                  lVar13 = 0;
                  do {
                    iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_78,4);
                    if (CONCAT44(extraout_var_06,iVar11) != 4) {
                      load_param_bin();
                      goto LAB_001488f2;
                    }
                    (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_start[(int)local_78.data].consumer =
                         (int)uVar15;
                    (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar13] = (int)local_78.data;
                    lVar13 = lVar13 + 1;
                  } while (lVar13 < local_11c);
                }
                local_b8 = &local_d0->tops;
                std::vector<int,_std::allocator<int>_>::resize(local_b8,(long)local_120);
                if (0 < local_120) {
                  lVar13 = 0;
                  do {
                    iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_78,4);
                    if (CONCAT44(extraout_var_07,iVar11) != 4) {
                      load_param_bin();
                      goto LAB_001488f2;
                    }
                    (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_start[(int)local_78.data].producer =
                         (int)uVar15;
                    (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar13] = (int)local_78.data;
                    lVar13 = lVar13 + 1;
                  } while (lVar13 < local_120);
                }
                iVar11 = ParamDict::load_param_bin(&local_98,dr);
                pLVar12 = local_d0;
                if (iVar11 == 0) {
                  if (local_d0->support_int8_storage == true) {
                    (this->opt).use_vulkan_compute = false;
                  }
                  local_118.cstep = 0;
                  local_118.data = (void *)0x0;
                  local_118.refcount._0_4_ = 0;
                  local_118.refcount._4_4_ = 0;
                  local_118.elemsize._0_4_ = 0;
                  local_118.elemsize._4_4_ = 0;
                  local_118.elempack = 0;
                  local_118.h = 0;
                  local_118.d = 0;
                  local_118.c = 0;
                  local_118.allocator = (Allocator *)0x0;
                  local_118.dims = 0;
                  local_118.w = 0;
                  ParamDict::get(&local_78,&local_98,0x1e,&local_118);
                  piVar14 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
                  if (piVar14 != (int *)0x0) {
                    LOCK();
                    *piVar14 = *piVar14 + -1;
                    UNLOCK();
                    if (*piVar14 == 0) {
                      if (local_118.allocator == (Allocator *)0x0) {
                        if (local_118.data != (void *)0x0) {
                          free(local_118.data);
                        }
                      }
                      else {
                        (*(local_118.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_80 = uVar15;
                  if (((CONCAT44(local_78.data._4_4_,(int)local_78.data) != 0) &&
                      ((long)local_78.c * local_78.cstep != 0)) && (0 < local_120)) {
                    piVar14 = (int *)(CONCAT44(local_78.data._4_4_,(int)local_78.data) + 0xc);
                    lVar13 = 0;
                    do {
                      iVar11 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start[lVar13];
                      pBVar3 = (this->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      iVar2 = piVar14[-3];
                      if (iVar2 == 3) {
                        local_118.w = piVar14[-2];
                        local_118.h = piVar14[-1];
                        local_118.c = *piVar14;
                        local_118.data = (void *)0x0;
                        local_118.refcount._0_4_ = 0;
                        local_118.refcount._4_4_ = 0;
                        local_118.elemsize._0_4_ = 4;
                        local_118.elemsize._4_4_ = 0;
                        local_118.elempack = 1;
                        local_118.allocator = (Allocator *)0x0;
                        local_118.dims = 3;
                        local_118.d = 1;
                        local_118.cstep =
                             (long)local_118.h * (long)local_118.w + 3U & 0x3ffffffffffffffc;
                        pLVar12 = local_d0;
                        if (&pBVar3[iVar11].shape != &local_118) {
                          piVar4 = pBVar3[iVar11].shape.refcount;
                          if (piVar4 != (int *)0x0) {
                            LOCK();
                            *piVar4 = *piVar4 + -1;
                            UNLOCK();
                            if (*piVar4 == 0) {
                              pvVar5 = pBVar3[iVar11].shape.data;
                              pAVar6 = pBVar3[iVar11].shape.allocator;
                              if (pAVar6 == (Allocator *)0x0) {
                                if (pvVar5 != (void *)0x0) {
                                  free(pvVar5);
                                }
                              }
                              else {
                                (*pAVar6->_vptr_Allocator[3])();
                              }
                            }
                          }
                          pBVar3[iVar11].shape.cstep = 0;
                          *(undefined8 *)((long)&pBVar3[iVar11].shape.refcount + 4) = 0;
                          *(undefined8 *)((long)&pBVar3[iVar11].shape.elemsize + 4) = 0;
                          pBVar3[iVar11].shape.data = (void *)0x0;
                          pBVar3[iVar11].shape.refcount = (int *)0x0;
                          pBVar3[iVar11].shape.dims = 0;
                          pBVar3[iVar11].shape.w = 0;
                          pBVar3[iVar11].shape.h = 0;
                          pBVar3[iVar11].shape.d = 0;
                          pBVar3[iVar11].shape.c = 0;
                          pBVar3[iVar11].shape.data = local_118.data;
                          piVar4 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_
                                                  );
                          pBVar3[iVar11].shape.refcount = piVar4;
                          pBVar3[iVar11].shape.elemsize =
                               CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
                          pBVar3[iVar11].shape.elempack = local_118.elempack;
                          pBVar3[iVar11].shape.allocator = local_118.allocator;
                          pBVar3[iVar11].shape.dims = local_118.dims;
                          pBVar3[iVar11].shape.w = local_118.w;
                          pBVar3[iVar11].shape.h = local_118.h;
                          pBVar3[iVar11].shape.d = local_118.d;
                          pBVar3[iVar11].shape.c = local_118.c;
                          pBVar3[iVar11].shape.cstep = local_118.cstep;
                          pLVar12 = local_d0;
                          if (piVar4 != (int *)0x0) {
                            LOCK();
                            *piVar4 = *piVar4 + -1;
                            UNLOCK();
                            if (*piVar4 == 0) {
                              if (local_118.allocator == (Allocator *)0x0) {
LAB_00148582:
                                pLVar12 = local_d0;
                                if (local_118.data != (void *)0x0) {
                                  free(local_118.data);
                                  pLVar12 = local_d0;
                                }
                              }
                              else {
                                (*(local_118.allocator)->_vptr_Allocator[3])();
                                pLVar12 = local_d0;
                              }
                            }
                          }
                        }
                      }
                      else if (iVar2 == 2) {
                        local_118.w = piVar14[-2];
                        local_118.h = piVar14[-1];
                        local_118.data = (void *)0x0;
                        local_118.refcount._0_4_ = 0;
                        local_118.refcount._4_4_ = 0;
                        local_118.elemsize._0_4_ = 4;
                        local_118.elemsize._4_4_ = 0;
                        local_118.elempack = 1;
                        local_118.allocator = (Allocator *)0x0;
                        local_118.dims = 2;
                        local_118.d = 1;
                        local_118.c = 1;
                        local_118.cstep = (long)local_118.h * (long)local_118.w;
                        pLVar12 = local_d0;
                        if (&pBVar3[iVar11].shape != &local_118) {
                          piVar4 = pBVar3[iVar11].shape.refcount;
                          if (piVar4 != (int *)0x0) {
                            LOCK();
                            *piVar4 = *piVar4 + -1;
                            UNLOCK();
                            if (*piVar4 == 0) {
                              pvVar5 = pBVar3[iVar11].shape.data;
                              pAVar6 = pBVar3[iVar11].shape.allocator;
                              if (pAVar6 == (Allocator *)0x0) {
                                if (pvVar5 != (void *)0x0) {
                                  free(pvVar5);
                                }
                              }
                              else {
                                (*pAVar6->_vptr_Allocator[3])();
                              }
                            }
                          }
                          pBVar3[iVar11].shape.cstep = 0;
                          *(undefined8 *)((long)&pBVar3[iVar11].shape.refcount + 4) = 0;
                          *(undefined8 *)((long)&pBVar3[iVar11].shape.elemsize + 4) = 0;
                          pBVar3[iVar11].shape.data = (void *)0x0;
                          pBVar3[iVar11].shape.refcount = (int *)0x0;
                          pBVar3[iVar11].shape.dims = 0;
                          pBVar3[iVar11].shape.w = 0;
                          pBVar3[iVar11].shape.h = 0;
                          pBVar3[iVar11].shape.d = 0;
                          pBVar3[iVar11].shape.c = 0;
                          pBVar3[iVar11].shape.data = local_118.data;
                          piVar4 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_
                                                  );
                          pBVar3[iVar11].shape.refcount = piVar4;
                          pBVar3[iVar11].shape.elemsize =
                               CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
                          pBVar3[iVar11].shape.elempack = local_118.elempack;
                          pBVar3[iVar11].shape.allocator = local_118.allocator;
                          pBVar3[iVar11].shape.dims = local_118.dims;
                          pBVar3[iVar11].shape.w = local_118.w;
                          pBVar3[iVar11].shape.h = local_118.h;
                          pBVar3[iVar11].shape.d = local_118.d;
                          pBVar3[iVar11].shape.c = local_118.c;
                          pBVar3[iVar11].shape.cstep = local_118.cstep;
                          pLVar12 = local_d0;
                          if (piVar4 != (int *)0x0) {
                            LOCK();
                            *piVar4 = *piVar4 + -1;
                            UNLOCK();
                            if (*piVar4 == 0) {
                              if (local_118.allocator == (Allocator *)0x0) goto LAB_00148582;
                              (*(local_118.allocator)->_vptr_Allocator[3])();
                              pLVar12 = local_d0;
                            }
                          }
                        }
                      }
                      else if (iVar2 == 1) {
                        local_118.w = piVar14[-2];
                        local_118.cstep = (size_t)local_118.w;
                        local_118.data = (void *)0x0;
                        local_118.refcount._0_4_ = 0;
                        local_118.refcount._4_4_ = 0;
                        local_118.elemsize._0_4_ = 4;
                        local_118.elemsize._4_4_ = 0;
                        local_118.elempack = 1;
                        local_118.allocator = (Allocator *)0x0;
                        local_118.dims = 1;
                        local_118.h = 1;
                        local_118.d = 1;
                        local_118.c = 1;
                        pLVar12 = local_d0;
                        if (&pBVar3[iVar11].shape != &local_118) {
                          piVar4 = pBVar3[iVar11].shape.refcount;
                          if (piVar4 != (int *)0x0) {
                            LOCK();
                            *piVar4 = *piVar4 + -1;
                            UNLOCK();
                            if (*piVar4 == 0) {
                              pvVar5 = pBVar3[iVar11].shape.data;
                              pAVar6 = pBVar3[iVar11].shape.allocator;
                              if (pAVar6 == (Allocator *)0x0) {
                                if (pvVar5 != (void *)0x0) {
                                  free(pvVar5);
                                }
                              }
                              else {
                                (*pAVar6->_vptr_Allocator[3])();
                              }
                            }
                          }
                          pBVar3[iVar11].shape.cstep = 0;
                          *(undefined8 *)((long)&pBVar3[iVar11].shape.refcount + 4) = 0;
                          *(undefined8 *)((long)&pBVar3[iVar11].shape.elemsize + 4) = 0;
                          pBVar3[iVar11].shape.data = (void *)0x0;
                          pBVar3[iVar11].shape.refcount = (int *)0x0;
                          pBVar3[iVar11].shape.dims = 0;
                          pBVar3[iVar11].shape.w = 0;
                          pBVar3[iVar11].shape.h = 0;
                          pBVar3[iVar11].shape.d = 0;
                          pBVar3[iVar11].shape.c = 0;
                          pBVar3[iVar11].shape.data = local_118.data;
                          piVar4 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_
                                                  );
                          pBVar3[iVar11].shape.refcount = piVar4;
                          pBVar3[iVar11].shape.elemsize =
                               CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
                          pBVar3[iVar11].shape.elempack = local_118.elempack;
                          pBVar3[iVar11].shape.allocator = local_118.allocator;
                          pBVar3[iVar11].shape.dims = local_118.dims;
                          pBVar3[iVar11].shape.w = local_118.w;
                          pBVar3[iVar11].shape.h = local_118.h;
                          pBVar3[iVar11].shape.d = local_118.d;
                          pBVar3[iVar11].shape.c = local_118.c;
                          pBVar3[iVar11].shape.cstep = local_118.cstep;
                          pLVar12 = local_d0;
                          if (piVar4 != (int *)0x0) {
                            LOCK();
                            *piVar4 = *piVar4 + -1;
                            UNLOCK();
                            if (*piVar4 == 0) {
                              if (local_118.allocator == (Allocator *)0x0) goto LAB_00148582;
                              (*(local_118.allocator)->_vptr_Allocator[3])();
                              pLVar12 = local_d0;
                            }
                          }
                        }
                      }
                      lVar13 = lVar13 + 1;
                      piVar14 = piVar14 + 4;
                    } while (lVar13 < local_120);
                  }
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                            (&pLVar12->bottom_shapes,(long)local_11c);
                  if (0 < local_11c) {
                    lVar13 = 0;
                    lVar16 = 0;
                    iVar11 = local_11c;
                    do {
                      iVar2 = (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar16];
                      pBVar3 = (this->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar7 = (pLVar12->bottom_shapes).
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      puVar1 = (undefined8 *)((long)&pMVar7->data + lVar13);
                      if ((Mat *)puVar1 != &pBVar3[iVar2].shape) {
                        piVar14 = pBVar3[iVar2].shape.refcount;
                        if (piVar14 != (int *)0x0) {
                          LOCK();
                          *piVar14 = *piVar14 + 1;
                          UNLOCK();
                        }
                        piVar14 = *(int **)((long)&pMVar7->refcount + lVar13);
                        if (piVar14 != (int *)0x0) {
                          LOCK();
                          *piVar14 = *piVar14 + -1;
                          UNLOCK();
                          if (*piVar14 == 0) {
                            pvVar5 = *(void **)((long)&pMVar7->data + lVar13);
                            plVar8 = *(long **)((long)&pMVar7->allocator + lVar13);
                            if (plVar8 == (long *)0x0) {
                              if (pvVar5 != (void *)0x0) {
                                free(pvVar5);
                              }
                            }
                            else {
                              (**(code **)(*plVar8 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar7->cstep + lVar13) = 0;
                        *(undefined8 *)((long)puVar1 + 0xc) = 0;
                        *(undefined8 *)((long)puVar1 + 0x14) = 0;
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        puVar1 = (undefined8 *)((long)&pMVar7->dims + lVar13);
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        *(undefined4 *)((long)&pMVar7->c + lVar13) = 0;
                        piVar14 = pBVar3[iVar2].shape.refcount;
                        puVar1 = (undefined8 *)((long)&pMVar7->data + lVar13);
                        *puVar1 = pBVar3[iVar2].shape.data;
                        puVar1[1] = piVar14;
                        *(size_t *)((long)&pMVar7->elemsize + lVar13) = pBVar3[iVar2].shape.elemsize
                        ;
                        *(int *)((long)&pMVar7->elempack + lVar13) = pBVar3[iVar2].shape.elempack;
                        *(Allocator **)((long)&pMVar7->allocator + lVar13) =
                             pBVar3[iVar2].shape.allocator;
                        iVar11 = pBVar3[iVar2].shape.w;
                        iVar9 = pBVar3[iVar2].shape.h;
                        iVar10 = pBVar3[iVar2].shape.d;
                        piVar14 = (int *)((long)&pMVar7->dims + lVar13);
                        *piVar14 = pBVar3[iVar2].shape.dims;
                        piVar14[1] = iVar11;
                        piVar14[2] = iVar9;
                        piVar14[3] = iVar10;
                        *(int *)((long)&pMVar7->c + lVar13) = pBVar3[iVar2].shape.c;
                        *(size_t *)((long)&pMVar7->cstep + lVar13) = pBVar3[iVar2].shape.cstep;
                        iVar11 = local_11c;
                      }
                      lVar16 = lVar16 + 1;
                      lVar13 = lVar13 + 0x48;
                      this = local_a8;
                    } while (lVar16 < iVar11);
                  }
                  this_00 = &local_d0->top_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                            (this_00,(long)local_120);
                  if (0 < local_120) {
                    lVar16 = 0;
                    lVar13 = 0;
                    iVar11 = local_120;
                    do {
                      iVar2 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar13];
                      pBVar3 = (this->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar7 = (this_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar1 = (undefined8 *)((long)&pMVar7->data + lVar16);
                      if ((Mat *)puVar1 != &pBVar3[iVar2].shape) {
                        piVar14 = pBVar3[iVar2].shape.refcount;
                        if (piVar14 != (int *)0x0) {
                          LOCK();
                          *piVar14 = *piVar14 + 1;
                          UNLOCK();
                        }
                        piVar14 = *(int **)((long)&pMVar7->refcount + lVar16);
                        if (piVar14 != (int *)0x0) {
                          LOCK();
                          *piVar14 = *piVar14 + -1;
                          UNLOCK();
                          if (*piVar14 == 0) {
                            pvVar5 = *(void **)((long)&pMVar7->data + lVar16);
                            plVar8 = *(long **)((long)&pMVar7->allocator + lVar16);
                            if (plVar8 == (long *)0x0) {
                              if (pvVar5 != (void *)0x0) {
                                free(pvVar5);
                              }
                            }
                            else {
                              (**(code **)(*plVar8 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar7->cstep + lVar16) = 0;
                        *(undefined8 *)((long)puVar1 + 0xc) = 0;
                        *(undefined8 *)((long)puVar1 + 0x14) = 0;
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        puVar1 = (undefined8 *)((long)&pMVar7->dims + lVar16);
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        *(undefined4 *)((long)&pMVar7->c + lVar16) = 0;
                        piVar14 = pBVar3[iVar2].shape.refcount;
                        puVar1 = (undefined8 *)((long)&pMVar7->data + lVar16);
                        *puVar1 = pBVar3[iVar2].shape.data;
                        puVar1[1] = piVar14;
                        *(size_t *)((long)&pMVar7->elemsize + lVar16) = pBVar3[iVar2].shape.elemsize
                        ;
                        *(int *)((long)&pMVar7->elempack + lVar16) = pBVar3[iVar2].shape.elempack;
                        *(Allocator **)((long)&pMVar7->allocator + lVar16) =
                             pBVar3[iVar2].shape.allocator;
                        iVar11 = pBVar3[iVar2].shape.w;
                        iVar9 = pBVar3[iVar2].shape.h;
                        iVar10 = pBVar3[iVar2].shape.d;
                        piVar14 = (int *)((long)&pMVar7->dims + lVar16);
                        *piVar14 = pBVar3[iVar2].shape.dims;
                        piVar14[1] = iVar11;
                        piVar14[2] = iVar9;
                        piVar14[3] = iVar10;
                        *(int *)((long)&pMVar7->c + lVar16) = pBVar3[iVar2].shape.c;
                        *(size_t *)((long)&pMVar7->cstep + lVar16) = pBVar3[iVar2].shape.cstep;
                        iVar11 = local_120;
                      }
                      lVar13 = lVar13 + 1;
                      lVar16 = lVar16 + 0x48;
                      this = local_a8;
                    } while (lVar13 < iVar11);
                  }
                  pLVar12 = local_d0;
                  iVar11 = (*local_d0->_vptr_Layer[2])(local_d0,&local_98);
                  uVar15 = local_80;
                  dr = local_88;
                  if (iVar11 == 0) {
                    (this->d->layers).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[local_80] = pLVar12;
                    iVar11 = 0;
                  }
                  else {
                    load_param_bin();
                    iVar11 = 0xe;
                  }
                  if (local_78.refcount != (int *)0x0) {
                    LOCK();
                    *local_78.refcount = *local_78.refcount + -1;
                    UNLOCK();
                    if (*local_78.refcount == 0) {
                      if (local_78.allocator == (Allocator *)0x0) {
                        if ((void *)CONCAT44(local_78.data._4_4_,(int)local_78.data) != (void *)0x0)
                        {
                          free((void *)CONCAT44(local_78.data._4_4_,(int)local_78.data));
                        }
                      }
                      else {
                        (*(local_78.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if ((iVar11 != 0xe) && (iVar11 != 0)) goto LAB_001488f2;
                }
                else {
                  fprintf(_stderr,"ParamDict load_param %d %s failed",uVar15 & 0xffffffff,
                          (local_d0->name)._M_dataplus._M_p);
                  fputc(10,_stderr);
                }
                uVar15 = uVar15 + 1;
              } while ((long)uVar15 < (long)local_bc);
            }
            iVar11 = 0;
            NetPrivate::update_input_output_indexes(this->d);
LAB_001488f7:
            ParamDict::~ParamDict(&local_98);
            return iVar11;
          }
          load_param_bin();
        }
        else {
          load_param_bin();
        }
      }
      else {
        load_param_bin();
      }
    }
    else {
      load_param_bin();
    }
  }
  else {
    load_param_bin();
  }
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize(layer_count);
    d->blobs.resize(blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i = 0; i < layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        //         layer->type = std::string(layer_type);
        //         layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = d->blobs[top_blob_index];

            //             blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("ParamDict load_param %d failed", i);
#endif
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_param %d failed", i);
#endif
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();

#undef READ_VALUE
    return 0;
}